

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popups.cpp
# Opt level: O2

bool __thiscall CEditor::PopupColorPicker(CEditor *this,void *pContext,CUIRect View)

{
  CUI *this_00;
  vec3 rgb;
  bool bVar1;
  int iVar2;
  long lVar3;
  float *pfVar4;
  long in_FS_OFFSET;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  vec3 vVar11;
  vec3 hsv;
  vec3 hsv_00;
  vec3 hsv_01;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 local_15c;
  undefined8 local_138;
  CQuadItem QuadItemMarker;
  float Y;
  float X;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  CUIRect Palette;
  CUIRect HuePicker;
  CUIRect SVPicker;
  CUIRect View_local;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  undefined4 local_88;
  anon_union_4_3_4e90b46e_for_vector3_base<float>_1 aStack_84;
  anon_union_4_3_4e90b0cd_for_vector3_base<float>_3 aStack_80;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 aStack_7c;
  undefined8 local_78;
  undefined8 local_70;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 aStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined8 local_5c;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 aStack_54;
  undefined8 uStack_50;
  undefined8 local_48;
  anon_union_4_4_d826a04f_for_vector3_base<float>_5 aStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  View_local = View;
  CUIRect::HSplitBottom(&View_local,20.0,&SVPicker,&Palette);
  CUIRect::VSplitRight(&SVPicker,20.0,&SVPicker,&HuePicker);
  CUIRect::VSplitLeft(&HuePicker,4.0,(CUIRect *)0x0,&HuePicker);
  CUIRect::HSplitTop(&Palette,4.0,(CUIRect *)0x0,&Palette);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
            (this->m_pGraphics,0xffffffffffffffff);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  local_138._0_4_ = (this->m_SelectedPickerColor).field_0;
  local_138._4_4_ = (this->m_SelectedPickerColor).field_1;
  local_15c = (anon_union_4_4_d826a04f_for_vector3_base<float>_5)
              (this->m_SelectedPickerColor).field_2.z;
  vVar11.field_2.z = 1.0;
  vVar11.field_0 = (anon_union_4_3_4e90b46e_for_vector3_base<float>_1)(int)(local_138 & 0xffffffff);
  vVar11.field_1 =
       (anon_union_4_3_4e90b0cd_for_vector3_base<float>_3)(int)((local_138 & 0xffffffff) >> 0x20);
  vVar11 = HsvToRgb(vVar11);
  aStack_7c = vVar11.field_2;
  local_88 = 0;
  aStack_84 = vVar11.field_0;
  aStack_80 = vVar11.field_1;
  local_78 = CONCAT44(local_78._4_4_,0x3f800000);
  hsv.field_1.y = 1.0;
  hsv.field_0 = local_138._0_4_;
  hsv.field_2.z = 1.0;
  vVar11 = HsvToRgb(hsv);
  aStack_68 = vVar11.field_2;
  local_78 = CONCAT44(1,(undefined4)local_78);
  local_70 = vVar11._0_8_;
  uStack_64 = 0x3f800000;
  hsv_00.field_1.y = 1.0;
  hsv_00.field_0 = local_138._0_4_;
  hsv_00.field_2.z = 1.0;
  vVar11 = HsvToRgb(hsv_00);
  aStack_54 = vVar11.field_2;
  uStack_60 = 2;
  local_5c = vVar11._0_8_;
  uStack_50 = CONCAT44(uStack_50._4_4_,0x3f800000);
  hsv_01.field_2.z = 1.0;
  hsv_01.field_0 = (anon_union_4_3_4e90b46e_for_vector3_base<float>_1)(int)(local_138 & 0xffffffff);
  hsv_01.field_1 =
       (anon_union_4_3_4e90b0cd_for_vector3_base<float>_3)(int)((local_138 & 0xffffffff) >> 0x20);
  vVar11 = HsvToRgb(hsv_01);
  aStack_40 = vVar11.field_2;
  uStack_50 = CONCAT44(3,(undefined4)uStack_50);
  local_48 = vVar11._0_8_;
  uStack_3c = 0x3f800000;
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x20])(this->m_pGraphics,&local_88,4);
  local_f8 = SVPicker.x;
  fStack_f4 = SVPicker.y;
  fStack_f0 = SVPicker.w;
  fStack_ec = SVPicker.h;
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(this->m_pGraphics,&local_f8,1);
  local_88 = 0;
  aStack_84 = (anon_union_4_3_4e90b46e_for_vector3_base<float>_1)0x0;
  aStack_80 = (anon_union_4_3_4e90b0cd_for_vector3_base<float>_3)0x0;
  aStack_7c = (anon_union_4_4_d826a04f_for_vector3_base<float>_5)0x0;
  local_78 = 0x100000000;
  local_70 = 0;
  aStack_68 = (anon_union_4_4_d826a04f_for_vector3_base<float>_5)0x0;
  uStack_64 = 0;
  uStack_60 = 2;
  local_5c = 0;
  aStack_54 = (anon_union_4_4_d826a04f_for_vector3_base<float>_5)0x0;
  uStack_50 = 0x33f800000;
  local_48 = 0;
  aStack_40 = (anon_union_4_4_d826a04f_for_vector3_base<float>_5)0x0;
  uStack_3c = 0x3f800000;
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x20])(this->m_pGraphics,&local_88,4);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(this->m_pGraphics,&local_f8,1);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  fVar5 = local_138._4_4_ * SVPicker.w;
  fVar6 = (1.0 - local_15c.z) * SVPicker.h;
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
            (0x3f000000,0x3f000000,0x3f000000,0x3f800000);
  fVar7 = SVPicker.x + fVar5;
  fVar8 = SVPicker.y + fVar6;
  this_00 = &this->m_UI;
  fVar9 = CUI::PixelSize(this_00);
  fVar10 = CUI::PixelSize(this_00);
  local_9c = CUI::PixelSize(this_00);
  local_9c = local_9c * 11.0;
  local_a8 = fVar7;
  local_a4 = fVar9 * -5.0 + fVar8;
  local_a0 = fVar10;
  fVar7 = CUI::PixelSize(this_00);
  fVar8 = CUI::PixelSize(this_00);
  local_8c = CUI::PixelSize(this_00);
  local_98 = fVar7 * -5.0 + fVar5 + SVPicker.x;
  local_94 = fVar6 + SVPicker.y;
  local_90 = fVar8 * 11.0;
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(this->m_pGraphics,&local_a8,2);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  bVar1 = CUI::DoPickerLogic(this_00,&PopupColorPicker::s_SVPicker,&SVPicker,&X,&Y);
  if (bVar1) {
    local_15c.z = 1.0 - Y / SVPicker.h;
    local_138 = CONCAT44(X / SVPicker.w,local_138._0_4_);
  }
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  fVar5 = HuePicker.h / 6.0;
  pfVar4 = PopupColorPicker::s_aColorIndices[1] + 2;
  for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
    aStack_7c = (anon_union_4_4_d826a04f_for_vector3_base<float>_5)pfVar4[-3];
    aStack_54 = (anon_union_4_4_d826a04f_for_vector3_base<float>_5)*pfVar4;
    local_88 = 0;
    local_70 = *(undefined8 *)(pfVar4 + -5);
    aStack_84 = SUB84(local_70,0);
    aStack_80 = SUB84((ulong)local_70 >> 0x20,0);
    local_78 = 0x13f800000;
    uStack_64 = 0x3f800000;
    uStack_60 = 2;
    local_5c = *(undefined8 *)*(float (*) [3])(pfVar4 + -2);
    uStack_50 = 0x33f800000;
    uStack_3c = 0x3f800000;
    aStack_68 = aStack_7c;
    local_48 = local_5c;
    aStack_40 = aStack_54;
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x20])(this->m_pGraphics,&local_88,4);
    QuadItemMarker.m_Y = (float)(int)lVar3 * fVar5 + HuePicker.y;
    QuadItemMarker.m_X = HuePicker.x;
    QuadItemMarker.m_Width = HuePicker.w;
    QuadItemMarker.m_Height = fVar5;
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1d])
              (this->m_pGraphics,&QuadItemMarker,1);
    pfVar4 = pfVar4 + 3;
  }
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
            (0x3f000000,0x3f000000,0x3f000000,0x3f800000);
  fVar5 = (1.0 - local_138._0_4_) * HuePicker.h;
  QuadItemMarker.m_Height = CUI::PixelSize(this_00);
  QuadItemMarker.m_X = HuePicker.x;
  QuadItemMarker.m_Width = HuePicker.w;
  QuadItemMarker.m_Y = fVar5 + HuePicker.y;
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1d])
            (this->m_pGraphics,&QuadItemMarker,1);
  (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  bVar1 = CUI::DoPickerLogic(this_00,&PopupColorPicker::s_HuePicker,&HuePicker,&X,&Y);
  if (bVar1) {
    local_138 = CONCAT44(local_138._4_4_,1.0 - Y / HuePicker.h);
  }
  CUIRect::Draw(&Palette,&this->m_SelectedColor,0.0,0);
  iVar2 = DoButton_Editor_Common
                    (this,&PopupColorPicker::s_Palette,(char *)0x0,0,&Palette,0,(char *)0x0);
  if ((iVar2 != 0) && (0.0 < (this->m_SelectedColor).field_3.w)) {
    rgb.field_0 = *(anon_union_4_3_4e90b46e_for_vector3_base<float>_1 *)
                   &(this->m_SelectedColor).field_0;
    rgb.field_1 = *(anon_union_4_3_4e90b0cd_for_vector3_base<float>_3 *)
                   &(this->m_SelectedColor).field_1;
    rgb.field_2 = *(anon_union_4_4_d826a04f_for_vector3_base<float>_5 *)
                   &(this->m_SelectedColor).field_2;
    vVar11 = RgbToHsv(rgb);
    local_15c = vVar11.field_2;
    local_138._0_4_ = vVar11.field_0;
    local_138._4_4_ = vVar11.field_1;
  }
  (this->m_SelectedPickerColor).field_0 = local_138._0_4_;
  (this->m_SelectedPickerColor).field_1 = local_138._4_4_;
  (this->m_SelectedPickerColor).field_2.z = (float)local_15c;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return false;
}

Assistant:

bool CEditor::PopupColorPicker(void *pContext, CUIRect View)
{
	CEditor *pEditor = (CEditor *)pContext;
	CUIRect SVPicker, HuePicker, Palette;
	View.HSplitBottom(20.0f, &SVPicker, &Palette);
	SVPicker.VSplitRight(20.0f, &SVPicker, &HuePicker);
	HuePicker.VSplitLeft(4.0f, 0x0, &HuePicker);
	Palette.HSplitTop(4.0f, 0x0, &Palette);

	pEditor->Graphics()->TextureClear();
	pEditor->Graphics()->QuadsBegin();

	// base: white - hue
	vec3 hsv = pEditor->m_SelectedPickerColor;
	IGraphics::CColorVertex ColorArray[4];

	vec3 c = HsvToRgb(vec3(hsv.x, 0.0f, 1.0f));
	ColorArray[0] = IGraphics::CColorVertex(0, c.r, c.g, c.b, 1.0f);
	c = HsvToRgb(vec3(hsv.x, 1.0f, 1.0f));
	ColorArray[1] = IGraphics::CColorVertex(1, c.r, c.g, c.b, 1.0f);
	c = HsvToRgb(vec3(hsv.x, 1.0f, 1.0f));
	ColorArray[2] = IGraphics::CColorVertex(2, c.r, c.g, c.b, 1.0f);
	c = HsvToRgb(vec3(hsv.x, 0.0f, 1.0f));
	ColorArray[3] = IGraphics::CColorVertex(3, c.r, c.g, c.b, 1.0f);

	pEditor->Graphics()->SetColorVertex(ColorArray, 4);

	IGraphics::CQuadItem QuadItem(SVPicker.x, SVPicker.y, SVPicker.w, SVPicker.h);
	pEditor->Graphics()->QuadsDrawTL(&QuadItem, 1);

	// base: transparent - black
	ColorArray[0] = IGraphics::CColorVertex(0, 0.0f, 0.0f, 0.0f, 0.0f);
	ColorArray[1] = IGraphics::CColorVertex(1, 0.0f, 0.0f, 0.0f, 0.0f);
	ColorArray[2] = IGraphics::CColorVertex(2, 0.0f, 0.0f, 0.0f, 1.0f);
	ColorArray[3] = IGraphics::CColorVertex(3, 0.0f, 0.0f, 0.0f, 1.0f);

	pEditor->Graphics()->SetColorVertex(ColorArray, 4);

	pEditor->Graphics()->QuadsDrawTL(&QuadItem, 1);

	pEditor->Graphics()->QuadsEnd();

	// marker
	vec2 Marker = vec2(hsv.y, (1.0f - hsv.z)) * vec2(SVPicker.w, SVPicker.h);
	pEditor->Graphics()->QuadsBegin();
	pEditor->Graphics()->SetColor(0.5f, 0.5f, 0.5f, 1.0f);
	IGraphics::CQuadItem aMarker[2];
	aMarker[0] = IGraphics::CQuadItem(SVPicker.x+Marker.x, SVPicker.y+Marker.y - 5.0f*pEditor->UI()->PixelSize(), pEditor->UI()->PixelSize(), 11.0f*pEditor->UI()->PixelSize());
	aMarker[1] = IGraphics::CQuadItem(SVPicker.x+Marker.x - 5.0f*pEditor->UI()->PixelSize(), SVPicker.y+Marker.y, 11.0f*pEditor->UI()->PixelSize(), pEditor->UI()->PixelSize());
	pEditor->Graphics()->QuadsDrawTL(aMarker, 2);
	pEditor->Graphics()->QuadsEnd();

	// logic
	float X, Y;
	static int s_SVPicker = 0;
	if(pEditor->UI()->DoPickerLogic(&s_SVPicker, &SVPicker, &X, &Y))
	{
		hsv.y = X/SVPicker.w;
		hsv.z = 1.0f - Y/SVPicker.h;
	}

	// hue slider
	static const float s_aColorIndices[7][3] = {
		{1.0f, 0.0f, 0.0f}, // red
		{1.0f, 0.0f, 1.0f},	// magenta
		{0.0f, 0.0f, 1.0f}, // blue
		{0.0f, 1.0f, 1.0f}, // cyan
		{0.0f, 1.0f, 0.0f}, // green
		{1.0f, 1.0f, 0.0f}, // yellow
		{1.0f, 0.0f, 0.0f}  // red
	};

	pEditor->Graphics()->QuadsBegin();
	vec4 ColorTop, ColorBottom;
	float Offset = HuePicker.h/6.0f;
	for(int j = 0; j < 6; j++)
	{
		ColorTop = vec4(s_aColorIndices[j][0], s_aColorIndices[j][1], s_aColorIndices[j][2], 1.0f);
		ColorBottom = vec4(s_aColorIndices[j+1][0], s_aColorIndices[j+1][1], s_aColorIndices[j+1][2], 1.0f);

		ColorArray[0] = IGraphics::CColorVertex(0, ColorTop.r, ColorTop.g, ColorTop.b, ColorTop.a);
		ColorArray[1] = IGraphics::CColorVertex(1, ColorTop.r, ColorTop.g, ColorTop.b, ColorTop.a);
		ColorArray[2] = IGraphics::CColorVertex(2, ColorBottom.r, ColorBottom.g, ColorBottom.b, ColorBottom.a);
		ColorArray[3] = IGraphics::CColorVertex(3, ColorBottom.r, ColorBottom.g, ColorBottom.b, ColorBottom.a);
		pEditor->Graphics()->SetColorVertex(ColorArray, 4);
		IGraphics::CQuadItem QuadItem(HuePicker.x, HuePicker.y+Offset*j, HuePicker.w, Offset);
		pEditor->Graphics()->QuadsDrawTL(&QuadItem, 1);
	}

	// marker
	pEditor->Graphics()->SetColor(0.5f, 0.5f, 0.5f, 1.0f);
	IGraphics::CQuadItem QuadItemMarker(HuePicker.x, HuePicker.y + (1.0f - hsv.x) * HuePicker.h, HuePicker.w, pEditor->UI()->PixelSize());
	pEditor->Graphics()->QuadsDrawTL(&QuadItemMarker, 1);

	pEditor->Graphics()->QuadsEnd();

	static int s_HuePicker = 0;
	if(pEditor->UI()->DoPickerLogic(&s_HuePicker, &HuePicker, &X, &Y))
	{
		hsv.x = 1.0f - Y/HuePicker.h;
	}

	// palette
	static int s_Palette = 0;
	Palette.Draw(pEditor->m_SelectedColor, 0.0f, CUIRect::CORNER_NONE);
	if(pEditor->DoButton_Editor_Common(&s_Palette, 0x0, 0, &Palette, 0, 0x0))
	{
		if(pEditor->m_SelectedColor.a > 0.0f)
			hsv = RgbToHsv(vec3(pEditor->m_SelectedColor.r, pEditor->m_SelectedColor.g, pEditor->m_SelectedColor.b));
	}

	pEditor->m_SelectedPickerColor = hsv;

	return false;
}